

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

module * __thiscall
pybind11::module::def<long(*)(long,long)>(module *this,char *name_,_func_long_long_long **f)

{
  _func_long_long_long *f_00;
  cpp_function func;
  handle local_50;
  handle local_48;
  object local_40;
  handle local_38;
  name local_30;
  sibling local_28;
  
  f_00 = *f;
  local_38.m_ptr = (this->super_object).super_handle.m_ptr;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_30.value = name_;
  local_50.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_50.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_50.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_28.value.m_ptr = (handle)(handle)local_50.m_ptr;
  cpp_function::cpp_function<long,long,long,pybind11::name,pybind11::scope,pybind11::sibling>
            ((cpp_function *)&local_48,f_00,&local_30,(scope *)&local_38,&local_28);
  object::~object((object *)&local_50);
  object::~object(&local_40);
  add_object(this,name_,local_48,true);
  object::~object((object *)&local_48);
  return this;
}

Assistant:

module &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }